

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O2

mat<4UL,_4UL> * __thiscall
mat<4UL,_4UL>::adjugate(mat<4UL,_4UL> *__return_storage_ptr__,mat<4UL,_4UL> *this)

{
  double dVar1;
  vec<4UL,_double> *this_00;
  double *pdVar2;
  size_t col;
  size_t i;
  size_t row;
  bool bVar3;
  
  __return_storage_ptr__->rows[3].data[2] = 0.0;
  __return_storage_ptr__->rows[3].data[3] = 0.0;
  __return_storage_ptr__->rows[3].data[0] = 0.0;
  __return_storage_ptr__->rows[3].data[1] = 0.0;
  __return_storage_ptr__->rows[2].data[2] = 0.0;
  __return_storage_ptr__->rows[2].data[3] = 0.0;
  __return_storage_ptr__->rows[2].data[0] = 0.0;
  __return_storage_ptr__->rows[2].data[1] = 0.0;
  __return_storage_ptr__->rows[1].data[2] = 0.0;
  __return_storage_ptr__->rows[1].data[3] = 0.0;
  __return_storage_ptr__->rows[1].data[0] = 0.0;
  __return_storage_ptr__->rows[1].data[1] = 0.0;
  __return_storage_ptr__->rows[0].data[2] = 0.0;
  __return_storage_ptr__->rows[0].data[3] = 0.0;
  __return_storage_ptr__->rows[0].data[0] = 0.0;
  __return_storage_ptr__->rows[0].data[1] = 0.0;
  row = 4;
  while (bVar3 = row != 0, row = row - 1, col = 3, bVar3) {
    for (; col != 0xffffffffffffffff; col = col - 1) {
      dVar1 = cofactor(this,row,col);
      this_00 = operator[](__return_storage_ptr__,row);
      pdVar2 = vec<4UL,_double>::operator[](this_00,col);
      *pdVar2 = dVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

mat<nrows, ncols> adjugate() const
    {
        mat<nrows, ncols> ret;
        for (size_t i = nrows; i--;)
            for (size_t j = ncols; j--; ret[i][j] = cofactor(i, j))
                ;
        return ret;
    }